

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::anon_unknown_0::ReferenceProgram::render
          (ReferenceProgram *this,Surface *target,float x1,float y1,float x2,float y2,
          DrawType drawType)

{
  long lVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  if ((int)target - 1U < 2) {
    fVar3 = (float)*(int *)(this + 4) * 0.5;
    fVar2 = (float)(*(int *)(this + 4) / 2);
    iVar7 = (int)(fVar2 + fVar3 * y1);
    iVar8 = (int)(fVar2 + fVar3 * y2);
    if (iVar7 <= iVar8) {
      fVar3 = (float)*(int *)this * 0.5;
      fVar2 = (float)(*(int *)this / 2);
      iVar4 = (int)(x1 * fVar3 + fVar2);
      iVar5 = (int)(x2 * fVar3 + fVar2);
      do {
        if (iVar4 <= iVar5) {
          lVar1 = *(long *)(this + 8);
          iVar6 = iVar4;
          do {
            *(undefined4 *)(lVar1 + (long)(*(int *)this * iVar7 + iVar6) * 4) = 0xff7f7f7f;
            iVar6 = iVar6 + 1;
          } while (iVar6 <= iVar5);
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 <= iVar8);
    }
  }
  return;
}

Assistant:

void ReferenceProgram::render (tcu::Surface* target, float x1, float y1, float x2, float y2, PreservingSwapTest::DrawType drawType)
{
	if (drawType == PreservingSwapTest::DRAWTYPE_GLES2_RENDER || drawType == PreservingSwapTest::DRAWTYPE_GLES2_CLEAR)
	{
		const int ox	= target->getWidth()/2;
		const int oy	= target->getHeight()/2;

		const int px	= target->getWidth();
		const int py	= target->getHeight();

		const int x1i	= (int)((px/2.0) * x1 + ox);
		const int y1i	= (int)((py/2.0) * y1 + oy);

		const int x2i	= (int)((px/2.0) * x2 + ox);
		const int y2i	= (int)((py/2.0) * y2 + oy);

		const tcu::RGBA	color(127, 127, 127, 255);

		for (int y = y1i; y <= y2i; y++)
		{
			for (int x = x1i; x <= x2i; x++)
				target->setPixel(x, y, color);
		}
	}
	else
		DE_ASSERT(false);
}